

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyPtr.h
# Opt level: O0

CopyPtr<slang::AssociativeArray> * __thiscall
slang::CopyPtr<slang::AssociativeArray>::operator=
          (CopyPtr<slang::AssociativeArray> *this,CopyPtr<slang::AssociativeArray> *other)

{
  AssociativeArray *pAVar1;
  CopyPtr<slang::AssociativeArray> *in_RSI;
  CopyPtr<slang::AssociativeArray> *in_RDI;
  void **in_stack_ffffffffffffffc8;
  AssociativeArray *in_stack_ffffffffffffffd0;
  
  if (in_RDI != in_RSI) {
    if (in_RDI->ptr != (AssociativeArray *)0x0) {
      AssociativeArray::~AssociativeArray(in_stack_ffffffffffffffd0);
      operator_delete(in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    }
    pAVar1 = std::exchange<slang::AssociativeArray*,decltype(nullptr)>
                       ((AssociativeArray **)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    in_RDI->ptr = pAVar1;
  }
  return in_RDI;
}

Assistant:

CopyPtr& operator=(CopyPtr&& other) noexcept {
        if (this != &other) {
            delete ptr;
            ptr = std::exchange(other.ptr, nullptr);
        }
        return *this;
    }